

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O2

void pbrt::anon_unknown_2::Serialize(uint8_t **ptr,string *s)

{
  size_t i;
  
  for (i = 0; i < s->_M_string_length; i = i + 1) {
    **ptr = (s->_M_dataplus)._M_p[i];
    *ptr = *ptr + 1;
  }
  **ptr = '\0';
  *ptr = *ptr + 1;
  return;
}

Assistant:

void Serialize(uint8_t **ptr, const std::string &s) {
    for (size_t i = 0; i < s.size(); ++i, *ptr += 1)
        **ptr = s[i];
    **ptr = '\0';
    *ptr += 1;
}